

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturemanager.cpp
# Opt level: O0

void __thiscall
QGestureManager::getGestureTargets
          (QGestureManager *this,QSet<QGesture_*> *gestures,
          QHash<QWidget_*,_QList<QGesture_*>_> *conflicts,
          QHash<QWidget_*,_QList<QGesture_*>_> *normal)

{
  bool bVar1;
  QGesture **ppQVar2;
  QWidget *pQVar3;
  QWidget **ppQVar4;
  QWidgetPrivate *pQVar5;
  long in_RDI;
  long in_FS_OFFSET;
  QWidget *w;
  QHash<QWidget_*,_QGesture_*> *gestures_1;
  QSet<QGesture_*> *__range1;
  const_iterator it;
  QWidget *widget;
  const_iterator wend;
  const_iterator wit;
  const_iterator gend;
  const_iterator git;
  QWidget *receiver;
  QGesture *gesture;
  const_iterator __end1;
  const_iterator __begin1;
  GestureByTypes gestureByTypes;
  QList<QGesture_*> *in_stack_fffffffffffffeb8;
  QWidget *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *in_stack_fffffffffffffed0;
  QHash<QGesture_*,_QPointer<QWidget>_> *in_stack_fffffffffffffed8;
  QWidget *local_110;
  QFlagsStorageHelper<Qt::GestureFlag,_4> local_c4;
  const_iterator local_c0;
  const_iterator local_b8;
  QWidget *local_b0;
  piter local_a8;
  piter local_98;
  piter local_88;
  piter local_78;
  GestureType local_64;
  QWidget *local_40;
  QGesture *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  QHash<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QHash<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>::QHash(&local_10);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  QSet<QGesture_*>::begin((QSet<QGesture_*> *)in_stack_fffffffffffffed8);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  QSet<QGesture_*>::end((QSet<QGesture_*> *)in_stack_fffffffffffffed8);
  while (bVar1 = QSet<QGesture_*>::const_iterator::operator!=
                           ((const_iterator *)in_stack_fffffffffffffec0,
                            (const_iterator *)in_stack_fffffffffffffeb8), bVar1) {
    ppQVar2 = QSet<QGesture_*>::const_iterator::operator*((const_iterator *)0x30ac6a);
    local_38 = *ppQVar2;
    in_stack_fffffffffffffed8 = (QHash<QGesture_*,_QPointer<QWidget>_> *)(in_RDI + 0x40);
    QPointer<QWidget>::QPointer
              ((QPointer<QWidget> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    QHash<QGesture_*,_QPointer<QWidget>_>::value
              (in_stack_fffffffffffffed8,(QGesture **)in_stack_fffffffffffffed0,
               (QPointer<QWidget> *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    pQVar3 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x30acc6);
    QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x30acd8);
    QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x30ace5);
    local_40 = pQVar3;
    if (pQVar3 != (QWidget *)0x0) {
      local_64 = QGesture::gestureType((QGesture *)0x30ad0a);
      QHash<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>::operator[]
                ((QHash<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_> *)in_stack_fffffffffffffed0,
                 (GestureType *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
      QHash<QWidget_*,_QGesture_*>::insert
                ((QHash<QWidget_*,_QGesture_*> *)in_stack_fffffffffffffec0,
                 (QWidget **)in_stack_fffffffffffffeb8,(QGesture **)0x30ad3e);
    }
    QSet<QGesture_*>::const_iterator::operator++((const_iterator *)in_stack_fffffffffffffec0);
  }
  local_78.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data<QHashPrivate::Node<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>_> *)
               &DAT_aaaaaaaaaaaaaaaa;
  local_78 = (piter)QHash<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>::cbegin
                              ((QHash<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_> *)
                               in_stack_fffffffffffffed8);
  local_88.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d = (Data<QHashPrivate::Node<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>_> *)
               &DAT_aaaaaaaaaaaaaaaa;
  local_88 = (piter)QHash<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>::cend
                              ((QHash<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_> *)
                               CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  do {
    bVar1 = QHash<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>::const_iterator::operator!=
                      ((const_iterator *)
                       CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                       (const_iterator *)in_stack_fffffffffffffec0);
    if (!bVar1) {
      QHash<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>::~QHash
                ((QHash<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_> *)in_stack_fffffffffffffec0)
      ;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
      __stack_chk_fail();
    }
    QHash<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>::const_iterator::value
              ((const_iterator *)0x30ae0c);
    local_98.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d = (Data<QHashPrivate::Node<QWidget_*,_QGesture_*>_> *)&DAT_aaaaaaaaaaaaaaaa;
    local_98 = (piter)QHash<QWidget_*,_QGesture_*>::cbegin
                                ((QHash<QWidget_*,_QGesture_*> *)in_stack_fffffffffffffed8);
    local_a8.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.d = (Data<QHashPrivate::Node<QWidget_*,_QGesture_*>_> *)&DAT_aaaaaaaaaaaaaaaa;
    local_a8 = (piter)QHash<QWidget_*,_QGesture_*>::cend
                                ((QHash<QWidget_*,_QGesture_*> *)
                                 CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    while (bVar1 = QHash<QWidget_*,_QGesture_*>::const_iterator::operator!=
                             ((const_iterator *)
                              CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                              (const_iterator *)in_stack_fffffffffffffec0), bVar1) {
      ppQVar4 = QHash<QWidget_*,_QGesture_*>::const_iterator::key((const_iterator *)0x30aeac);
      local_b0 = *ppQVar4;
      local_110 = QWidget::parentWidget((QWidget *)0x30aec4);
      while (local_110 != (QWidget *)0x0) {
        local_b8._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
        pQVar5 = QWidget::d_func((QWidget *)0x30aeee);
        in_stack_fffffffffffffed0 = &pQVar5->gestureContext;
        QHash<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>::const_iterator::key
                  ((const_iterator *)0x30af06);
        local_b8._M_node =
             (_Base_ptr)
             QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::constFind
                       ((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)in_stack_fffffffffffffeb8
                        ,(GestureType *)0x30af13);
        QWidget::d_func((QWidget *)0x30af25);
        local_c0._M_node =
             (_Base_ptr)
             QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::constEnd
                       ((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)in_stack_fffffffffffffeb8
                       );
        bVar1 = ::operator!=((const_iterator *)in_stack_fffffffffffffec0,
                             (const_iterator *)in_stack_fffffffffffffeb8);
        if (bVar1) {
          QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::const_iterator::value
                    ((const_iterator *)0x30af67);
          local_c4.super_QFlagsStorage<Qt::GestureFlag>.i =
               (QFlagsStorage<Qt::GestureFlag>)
               QFlags<Qt::GestureFlag>::operator&
                         ((QFlags<Qt::GestureFlag> *)in_stack_fffffffffffffec0,
                          (GestureFlag)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
          bVar1 = QFlags<Qt::GestureFlag>::operator!((QFlags<Qt::GestureFlag> *)&local_c4);
          in_stack_fffffffffffffecf = bVar1 && local_110 != local_b0;
          if ((bool)in_stack_fffffffffffffecf) {
            in_stack_fffffffffffffec0 =
                 (QWidget *)
                 QHash<QWidget_*,_QList<QGesture_*>_>::operator[]
                           ((QHash<QWidget_*,_QList<QGesture_*>_> *)in_stack_fffffffffffffed0,
                            (QWidget **)
                            CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
            QHash<QWidget_*,_QGesture_*>::const_iterator::value((const_iterator *)0x30afd9);
            QList<QGesture_*>::append
                      ((QList<QGesture_*> *)0x30afe6,(parameter_type)in_stack_fffffffffffffeb8);
            break;
          }
        }
        bVar1 = QWidget::isWindow(in_stack_fffffffffffffec0);
        if (bVar1) {
          local_110 = (QWidget *)0x0;
          break;
        }
        local_110 = QWidget::parentWidget((QWidget *)0x30b00f);
      }
      if (local_110 == (QWidget *)0x0) {
        in_stack_fffffffffffffeb8 =
             QHash<QWidget_*,_QList<QGesture_*>_>::operator[]
                       ((QHash<QWidget_*,_QList<QGesture_*>_> *)in_stack_fffffffffffffed0,
                        (QWidget **)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
        QHash<QWidget_*,_QGesture_*>::const_iterator::value((const_iterator *)0x30b044);
        QList<QGesture_*>::append
                  ((QList<QGesture_*> *)0x30b050,(parameter_type)in_stack_fffffffffffffeb8);
      }
      QHash<QWidget_*,_QGesture_*>::const_iterator::operator++
                ((const_iterator *)in_stack_fffffffffffffed0);
    }
    QHash<Qt::GestureType,_QHash<QWidget_*,_QGesture_*>_>::const_iterator::operator++
              ((const_iterator *)in_stack_fffffffffffffed0);
  } while( true );
}

Assistant:

void QGestureManager::getGestureTargets(const QSet<QGesture*> &gestures,
    QHash<QWidget *, QList<QGesture *> > *conflicts,
    QHash<QWidget *, QList<QGesture *> > *normal)
{
    typedef QHash<Qt::GestureType, QHash<QWidget *, QGesture *> > GestureByTypes;
    GestureByTypes gestureByTypes;

    // sort gestures by types
    for (QGesture *gesture : gestures) {
        QWidget *receiver = m_gestureTargets.value(gesture, nullptr);
        Q_ASSERT(receiver);
        if (receiver)
            gestureByTypes[gesture->gestureType()].insert(receiver, gesture);
    }

    // for each gesture type
    for (GestureByTypes::const_iterator git = gestureByTypes.cbegin(), gend = gestureByTypes.cend(); git != gend; ++git) {
        const QHash<QWidget *, QGesture *> &gestures = git.value();
        for (QHash<QWidget *, QGesture *>::const_iterator wit = gestures.cbegin(), wend = gestures.cend(); wit != wend; ++wit) {
            QWidget *widget = wit.key();
            QWidget *w = widget->parentWidget();
            while (w) {
                QMap<Qt::GestureType, Qt::GestureFlags>::const_iterator it
                        = w->d_func()->gestureContext.constFind(git.key());
                if (it != w->d_func()->gestureContext.constEnd()) {
                    // i.e. 'w' listens to gesture 'type'
                    if (!(it.value() & Qt::DontStartGestureOnChildren) && w != widget) {
                        // conflicting gesture!
                        (*conflicts)[widget].append(wit.value());
                        break;
                    }
                }
                if (w->isWindow()) {
                    w = nullptr;
                    break;
                }
                w = w->parentWidget();
            }
            if (!w)
                (*normal)[widget].append(wit.value());
        }
    }
}